

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

bool __thiscall Am_Value::operator==(Am_Value *this,Am_Generic_Procedure *test_value)

{
  ushort uVar1;
  bool bVar2;
  
  uVar1 = this->type;
  if ((((uVar1 & 0x7000) == 0x3000) || (uVar1 - 2 < 2)) || (uVar1 == 9)) {
    bVar2 = test_value == (Am_Generic_Procedure *)0x0 &&
            (this->value).wrapper_value == (Am_Wrapper *)0x0;
  }
  else {
    if (uVar1 != 10) {
      return false;
    }
    bVar2 = (this->value).wrapper_value == (Am_Wrapper *)test_value;
  }
  return bVar2;
}

Assistant:

bool
Am_Value::operator==(Am_Generic_Procedure *test_value) const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return !value.method_value && !test_value;
  switch (type) {
  case Am_PROC:
    return value.proc_value == test_value;
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return !value.voidptr_value && !test_value;
  default:
    return false;
  }
}